

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int ON_String::MapString
              (ON_Locale *locale,ON_StringMapType map_type,char *string,int element_count,
              char *mapped_string,int mapped_string_capacity)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  wchar_t *sWideChar;
  int local_78;
  int mapped_element_count;
  ON_wString local_68;
  ON_wString wide_mapped_string;
  ON_wString wide_string;
  char c;
  char *s1;
  char *s;
  char *pcStack_38;
  int mapped_string_capacity_local;
  char *mapped_string_local;
  int element_count_local;
  char *string_local;
  ON_StringMapType map_type_local;
  ON_Locale *locale_local;
  
  if (mapped_string_capacity < 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
               ,0xa4b,"","mapped_string_capacity is < 0.");
    return 0;
  }
  if (mapped_string_capacity == 0) {
    pcStack_38 = (char *)0x0;
  }
  else {
    pcStack_38 = mapped_string;
    if (0 < mapped_string_capacity) {
      if (mapped_string == (char *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
                   ,0xa55,"","mapped_string is nullptr.");
        return 0;
      }
      if (string != mapped_string) {
        *mapped_string = '\0';
      }
    }
  }
  mapped_string_local._4_4_ = element_count;
  if ((element_count < 0) &&
     (mapped_string_local._4_4_ = Length(string), mapped_string_local._4_4_ < 0)) {
    return 0;
  }
  if (mapped_string_local._4_4_ == 0) {
    return 1;
  }
  if (string == (char *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
               ,0xa6a,"","string is nullptr.");
    return 0;
  }
  bVar2 = ON_Locale::IsOrdinal(locale);
  if (bVar2) {
LAB_00856fa7:
    if (mapped_string_capacity == 0) {
      return mapped_string_local._4_4_;
    }
    if (map_type != UpperCase) {
      if (map_type != LowerCase) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
                   ,0xaac,"","invalid map_type.");
        return 0;
      }
      iVar3 = MapStringOrdinal(LowerOrdinal,string,mapped_string_local._4_4_,pcStack_38,
                               mapped_string_capacity);
      return iVar3;
    }
    iVar3 = MapStringOrdinal(UpperOrdinal,string,mapped_string_local._4_4_,pcStack_38,
                             mapped_string_capacity);
    return iVar3;
  }
  s1 = string;
  do {
    if (string + mapped_string_local._4_4_ <= s1) goto LAB_00856fa7;
    cVar1 = *s1;
  } while ((-1 < cVar1) && (s1 = s1 + 1, cVar1 < -0x80));
  ON_wString::ON_wString(&wide_mapped_string,string,mapped_string_local._4_4_);
  ON_wString::MapString(&local_68,(ON_Locale *)&wide_mapped_string,(ON_StringMapType)locale);
  sWideChar = ON_wString::operator_cast_to_wchar_t_(&local_68);
  iVar3 = ON_wString::Length(&local_68);
  local_78 = ON_ConvertWideCharToUTF8
                       (0,sWideChar,iVar3,pcStack_38,mapped_string_capacity,(uint *)0x0,0,0,
                        (wchar_t **)0x0);
  if ((mapped_string_capacity < 1) ||
     (iVar3 = ON_wString::Length(&local_68), iVar3 <= mapped_string_capacity)) {
    if ((string[mapped_string_local._4_4_ + -1] == '\0') && (local_78 < mapped_string_capacity)) {
      if (mapped_string_capacity <= local_78) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
                   ,0xa98,"","mapped_string_capacity too small.");
        locale_local._4_4_ = 0;
        goto LAB_00856f80;
      }
      pcStack_38[local_78] = '\0';
      local_78 = local_78 + 1;
    }
    locale_local._4_4_ = local_78;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
               ,0xa8b,"","mapped_string_capacity too small.");
    locale_local._4_4_ = 0;
  }
LAB_00856f80:
  ON_wString::~ON_wString(&local_68);
  ON_wString::~ON_wString(&wide_mapped_string);
  return locale_local._4_4_;
}

Assistant:

int ON_String::MapString(
  const class ON_Locale& locale,
  ON_StringMapType map_type,
  const char* string,
  int element_count,
  char* mapped_string,
  int mapped_string_capacity
  )
{
  if (mapped_string_capacity < 0)
  {
    ON_ERROR("mapped_string_capacity is < 0.");
    return 0;
  }

  if (0 == mapped_string_capacity)
    mapped_string = nullptr;
  else if (mapped_string_capacity > 0)
  {
    if (nullptr == mapped_string)
    {
      ON_ERROR("mapped_string is nullptr.");
      return 0;
    }
    if ( string != mapped_string )
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_String::Length(string);
    if (element_count < 0 )
      return 0; // string has more than max int elements - probably missing a null terminator.
  }

  if ( 0 == element_count)
  {
    return 1;
  }

  if (nullptr == string)
  {
    ON_ERROR("string is nullptr.");
    return 0;
  }

  if (false == locale.IsOrdinal())
  {
    const char* s = string;
    const char* s1 = s + element_count;
    while (s < s1)
    {
      char c = *s++;
      if (c >= 0 && c <= 127)
        continue;

      // UTF-8 multi char element code point
      // No robust UTF-8 tools are available from the Windows or Mac API.
      // TODO - investigate using ICU to avoid UTF-8 -> wide char -> UTF-8 conversion
      const ON_wString wide_string(string, element_count);
      const ON_wString wide_mapped_string = wide_string.MapString(locale, map_type);
      int mapped_element_count = ON_ConvertWideCharToUTF8(
        false, // bTestByteOrder
        static_cast<const wchar_t*>(wide_mapped_string),
        wide_mapped_string.Length(),
        mapped_string,
        mapped_string_capacity,
        nullptr,
        0,
        0,
        nullptr
        );

      if (mapped_string_capacity > 0 && wide_mapped_string.Length() > mapped_string_capacity)
      {
        ON_ERROR("mapped_string_capacity too small.");
        return 0;
      }

      if (0 == string[element_count - 1] && mapped_element_count < mapped_string_capacity)
      {
        if (mapped_element_count < mapped_string_capacity)
        {
          mapped_string[mapped_element_count] = 0;
          mapped_element_count++; // count the null terminator
        }
        else
        {
          ON_ERROR("mapped_string_capacity too small.");
          return 0;
        }
      }
      return mapped_element_count;
    }
  }

  if ( 0 == mapped_string_capacity )
    return element_count;

  switch (map_type)
  {
  case ON_StringMapType::UpperCase:
    return ON_String::MapStringOrdinal(ON_StringMapOrdinalType::UpperOrdinal,string,element_count,mapped_string,mapped_string_capacity);
    break;
  case ON_StringMapType::LowerCase:
    return ON_String::MapStringOrdinal(ON_StringMapOrdinalType::LowerOrdinal,string,element_count,mapped_string,mapped_string_capacity);
    break;
  default:
    ON_ERROR("invalid map_type.");
    break;
  }

  return 0;
}